

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_test.cpp
# Opt level: O3

void __thiscall jhu::thrax::AlignmentTests_Sort_Test::TestBody(AlignmentTests_Sort_Test *this)

{
  bool bVar1;
  char *in_RCX;
  char *pcVar2;
  string_view sv;
  AssertionResult gtest_ar;
  Alignment a;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  AssertHelper local_38;
  internal local_30 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  Alignment local_20;
  
  sv._M_str = in_RCX;
  sv._M_len = (size_t)"3-2 0-0";
  readAlignment(&local_20,(thrax *)0x7,sv);
  local_38.data_._0_4_ = 2;
  local_40.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)local_20.super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_20.super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>.
              _M_impl.super__Vector_impl_data._M_start >> 2);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_30,"2","a.size()",(int *)&local_38,(unsigned_long *)&local_40);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_28.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_28.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/alignment_test.cpp"
               ,0x4e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_40.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_40.ptr_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_40.ptr_ = local_40.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,short>
              (local_30,"0","a.front().src",(int *)&local_40,
               &(local_20.super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>.
                 _M_impl.super__Vector_impl_data._M_start)->src);
    if (local_30[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_40);
      if (local_28.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((local_28.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/alignment_test.cpp"
                 ,0x4f,pcVar2);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (local_40.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_40.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_40.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_40.ptr_ = local_40.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,short>
              (local_30,"0","a.front().tgt",(int *)&local_40,
               &(local_20.super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>.
                 _M_impl.super__Vector_impl_data._M_start)->tgt);
    if (local_30[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_40);
      if (local_28.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((local_28.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/alignment_test.cpp"
                 ,0x50,pcVar2);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (local_40.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_40.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_40.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_40.ptr_._0_4_ = 3;
    testing::internal::CmpHelperEQ<int,short>
              (local_30,"3","a.back().src",(int *)&local_40,
               &local_20.super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>.
                _M_impl.super__Vector_impl_data._M_finish[-1].src);
    if (local_30[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_40);
      if (local_28.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((local_28.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/alignment_test.cpp"
                 ,0x51,pcVar2);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (local_40.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_40.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_40.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_40.ptr_._0_4_ = 2;
    testing::internal::CmpHelperEQ<int,short>
              (local_30,"2","a.back().tgt",(int *)&local_40,
               &local_20.super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>.
                _M_impl.super__Vector_impl_data._M_finish[-1].tgt);
    if (local_30[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_40);
      if (local_28.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((local_28.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/alignment_test.cpp"
                 ,0x52,pcVar2);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (local_40.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_40.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_40.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if (local_20.super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_20.
                    super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_20.
                          super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_20.
                          super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(AlignmentTests, Sort) {
  auto a = readAlignment("3-2 0-0");
  ASSERT_EQ(2, a.size());
  EXPECT_EQ(0, a.front().src);
  EXPECT_EQ(0, a.front().tgt);
  EXPECT_EQ(3, a.back().src);
  EXPECT_EQ(2, a.back().tgt);

}